

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t archive_read_format_tar_skip(archive_read *a)

{
  tar *tar;
  ulong uVar1;
  int64_t iVar2;
  sparse_block *psVar3;
  wchar_t wVar4;
  ulong uVar5;
  
  tar = (tar *)a->format->data;
  psVar3 = (sparse_block *)&tar->sparse_list;
  uVar1 = 0;
  wVar4 = L'\xffffffe2';
  while( true ) {
    do {
      psVar3 = psVar3->next;
      if (psVar3 == (sparse_block *)0x0) {
        uVar5 = tar->entry_bytes_remaining;
        if ((long)uVar1 < tar->entry_bytes_remaining) {
          uVar5 = uVar1;
        }
        iVar2 = __archive_read_consume(a,uVar5 + tar->entry_padding + tar->entry_bytes_unconsumed);
        if (-1 < iVar2) {
          tar->entry_bytes_remaining = 0;
          tar->entry_padding = 0;
          tar->entry_bytes_unconsumed = 0;
          gnu_clear_sparse_list(tar);
          wVar4 = L'\0';
        }
        return wVar4;
      }
    } while (psVar3->hole != 0);
    if ((long)(uVar1 ^ 0x7fffffffffffffff) <= psVar3->remaining) break;
    uVar1 = uVar1 + psVar3->remaining;
  }
  return L'\xffffffe2';
}

Assistant:

static int
archive_read_format_tar_skip(struct archive_read *a)
{
	int64_t bytes_skipped;
	int64_t request;
	struct sparse_block *p;
	struct tar* tar;

	tar = (struct tar *)(a->format->data);

	/* Do not consume the hole of a sparse file. */
	request = 0;
	for (p = tar->sparse_list; p != NULL; p = p->next) {
		if (!p->hole) {
			if (p->remaining >= INT64_MAX - request) {
				return ARCHIVE_FATAL;
			}
			request += p->remaining;
		}
	}
	if (request > tar->entry_bytes_remaining)
		request = tar->entry_bytes_remaining;
	request += tar->entry_padding + tar->entry_bytes_unconsumed;

	bytes_skipped = __archive_read_consume(a, request);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	tar->entry_bytes_remaining = 0;
	tar->entry_bytes_unconsumed = 0;
	tar->entry_padding = 0;

	/* Free the sparse list. */
	gnu_clear_sparse_list(tar);

	return (ARCHIVE_OK);
}